

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall
Fl_Text_Display::handle_vline
          (Fl_Text_Display *this,int mode,int lineStartPos,int lineLen,int leftChar,int rightChar,
          int Y,int bottomClip,int leftClip,int rightClip)

{
  char c;
  int iVar1;
  uint uVar2;
  char *string;
  uint lineIndex;
  int iVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  char *pcVar7;
  double dVar8;
  uint local_6c;
  uint local_68;
  
  if (lineStartPos == -1) {
    string = (char *)0x0;
  }
  else {
    string = Fl_Text_Buffer::text_range(this->mBuffer,lineStartPos,lineLen + lineStartPos);
  }
  if (mode == 3) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    if (mode == 2) {
      mode = 1;
    }
    else {
      iVar4 = (this->text_area).x - this->mHorizOffset;
    }
  }
  if (string == (char *)0x0) {
    if (mode == 1) {
      return lineStartPos;
    }
    if (mode == 0) {
      iVar1 = position_style(this,lineStartPos,lineLen,-1);
      iVar4 = (this->text_area).x;
      draw_string(this,iVar1 + 0x1000,iVar4,Y,(this->text_area).w + iVar4,(char *)0x0,lineLen);
    }
    return 0;
  }
  lineIndex = 0;
  local_6c = position_style(this,lineStartPos,lineLen,0);
  if (lineLen < 1) {
    local_68 = 0;
LAB_001d2e14:
    pcVar7 = string + local_68;
    iVar1 = lineIndex - local_68;
    dVar8 = string_width(this,pcVar7,iVar1,local_6c);
    if (mode == 1) {
      iVar4 = find_x(this,pcVar7,iVar1,local_6c,rightClip - iVar4);
      free(string);
      return local_68 + lineStartPos + iVar4;
    }
    iVar5 = (int)dVar8;
    if (mode == 0) {
      iVar5 = iVar5 + iVar4;
      draw_string(this,local_6c,iVar4,Y,iVar5,pcVar7,iVar1);
LAB_001d2f10:
      iVar4 = position_style(this,lineStartPos,lineLen,lineIndex);
      draw_string(this,iVar4 + 0x1000,iVar5,Y,(this->text_area).w + (this->text_area).x,string,
                  lineLen);
      goto LAB_001d2f4c;
    }
  }
  else {
    lineIndex = 0;
    local_68 = 0;
    cVar6 = '\0';
    do {
      c = string[lineIndex];
      iVar1 = fl_utf8len1(c);
      if (iVar1 < 2) {
        iVar1 = 1;
      }
      uVar2 = position_style(this,lineStartPos,lineLen,lineIndex);
      if (((cVar6 == '\t') || (c == '\t')) || (uVar2 != local_6c)) {
        if (cVar6 == '\t') {
          iVar5 = this->mBuffer->mTabDist;
          dVar8 = this->mColumnScale;
          if ((dVar8 == 0.0) && (!NAN(dVar8))) {
            dVar8 = string_width(this,"Mitg",4,0x41);
            dVar8 = dVar8 * 0.25;
            this->mColumnScale = dVar8;
          }
          iVar3 = (int)(dVar8 * (double)iVar5);
          iVar5 = (this->mHorizOffset + iVar4) - (this->text_area).x;
          if (mode == 3) {
            iVar5 = iVar4;
          }
          iVar5 = (iVar5 / iVar3 + 1) * iVar3 - iVar5;
          if (mode == 1) {
            if (rightClip < iVar4 + iVar5) {
              free(string);
              return local_68 + lineStartPos;
            }
          }
          else if (mode == 0) {
            draw_string(this,local_6c | 0x1000,iVar4,Y,iVar4 + iVar5,(char *)0x0,0);
          }
        }
        else {
          pcVar7 = string + local_68;
          iVar3 = lineIndex - local_68;
          dVar8 = string_width(this,pcVar7,iVar3,local_6c);
          iVar5 = (int)dVar8;
          if (mode == 1) {
            if (rightClip < iVar4 + iVar5) {
              iVar4 = find_x(this,pcVar7,iVar3,local_6c,rightClip - iVar4);
              free(string);
              return local_68 + lineStartPos + iVar4;
            }
          }
          else if (mode == 0) {
            draw_string(this,local_6c,iVar4,Y,iVar4 + iVar5,pcVar7,iVar3);
          }
        }
        iVar4 = iVar4 + iVar5;
        local_6c = uVar2;
        local_68 = lineIndex;
      }
      lineIndex = lineIndex + iVar1;
      cVar6 = c;
    } while ((int)lineIndex < lineLen);
    if (c != '\t') goto LAB_001d2e14;
    iVar1 = this->mBuffer->mTabDist;
    dVar8 = this->mColumnScale;
    if ((dVar8 == 0.0) && (!NAN(dVar8))) {
      dVar8 = string_width(this,"Mitg",4,0x41);
      dVar8 = dVar8 * 0.25;
      this->mColumnScale = dVar8;
    }
    iVar1 = (int)(dVar8 * (double)iVar1);
    iVar5 = (this->mHorizOffset + iVar4) - (this->text_area).x;
    if (mode == 3) {
      iVar5 = iVar4;
    }
    iVar5 = (iVar5 / iVar1 + 1) * iVar1 - iVar5;
    if (mode == 0) {
      iVar5 = iVar5 + iVar4;
      draw_string(this,local_6c | 0x1000,iVar4,Y,iVar5,(char *)0x0,0);
      goto LAB_001d2f10;
    }
    if (mode == 1) {
      free(string);
      return (uint)(iVar5 < rightClip - iVar4) + local_68 + lineStartPos;
    }
  }
  if (mode == 3) {
    free(string);
    return iVar5 + iVar4;
  }
  position_style(this,lineStartPos,lineLen,lineIndex);
LAB_001d2f4c:
  free(string);
  return lineStartPos + lineLen;
}

Assistant:

int Fl_Text_Display::handle_vline(
                                  int mode,
                                  int lineStartPos, int lineLen, int leftChar, int rightChar,
                                  int Y, int bottomClip,
                                  int leftClip, int rightClip) const
{
  IS_UTF8_ALIGNED2(buffer(), lineStartPos)

  // FIXME: we need to allow two modes for FIND_INDEX: one on the edge of the
  // FIXME: character for selection, and one on the character center for cursors.
  int i, X, startX, startIndex, style, charStyle;
  char *lineStr;

  if ( lineStartPos == -1 ) {
    lineStr = NULL;
  } else {
    lineStr = mBuffer->text_range( lineStartPos, lineStartPos + lineLen );
  }

  if (mode==GET_WIDTH) {
    X = 0;
  } else if (mode==FIND_INDEX_FROM_ZERO) {
    X = 0;
    mode = FIND_INDEX;
  } else {
    X = text_area.x - mHorizOffset;
  }

  startX = X;
  startIndex = 0;
  if (!lineStr) {
    // just clear the background
    if (mode==DRAW_LINE) {
      style = position_style(lineStartPos, lineLen, -1);
      draw_string( style|BG_ONLY_MASK, text_area.x, Y, text_area.x+text_area.w, lineStr, lineLen );
    }
    if (mode==FIND_INDEX) {
      IS_UTF8_ALIGNED2(buffer(), lineStartPos)
      return lineStartPos;
    }
    return 0;
  }

  char currChar = 0, prevChar = 0;
  // draw the line
  style = position_style(lineStartPos, lineLen, 0);
  for (i=0; i<lineLen; ) {
    currChar = lineStr[i]; // one byte is enough to handele tabs and other cases
    int len = fl_utf8len1(currChar);
    if (len<=0) len = 1; // OUCH!
    charStyle = position_style(lineStartPos, lineLen, i);
    if (charStyle!=style || currChar=='\t' || prevChar=='\t') {
      // draw a segment whenever the style changes or a Tab is found
      int w = 0;
      if (prevChar=='\t') {
        // draw a single Tab space
        int tab = (int)col_to_x(mBuffer->tab_distance());
        int xAbs = (mode==GET_WIDTH) ? startX : startX+mHorizOffset-text_area.x;
        w = (((xAbs/tab)+1)*tab) - xAbs;
        if (mode==DRAW_LINE)
          draw_string( style|BG_ONLY_MASK, startX, Y, startX+w, 0, 0 );
        if (mode==FIND_INDEX && startX+w>rightClip) {
          // find x pos inside block
          free(lineStr);
          return lineStartPos + startIndex;
        }
      } else {
        // draw a text segment
        w = int( string_width( lineStr+startIndex, i-startIndex, style ) );
        if (mode==DRAW_LINE)
          draw_string( style, startX, Y, startX+w, lineStr+startIndex, i-startIndex );
        if (mode==FIND_INDEX && startX+w>rightClip) {
          // find x pos inside block
          int di = find_x(lineStr+startIndex, i-startIndex, style, rightClip-startX);
          free(lineStr);
          IS_UTF8_ALIGNED2(buffer(), (lineStartPos+startIndex+di))
          return lineStartPos + startIndex + di;
        }
      }
      style = charStyle;
      startX += w;
      startIndex = i;
    }
    i += len;
    prevChar = currChar;
  }
  int w = 0;
  if (currChar=='\t') {
    // draw a single Tab space
    int tab = (int)col_to_x(mBuffer->tab_distance());
    int xAbs = (mode==GET_WIDTH) ? startX : startX+mHorizOffset-text_area.x;
    w = (((xAbs/tab)+1)*tab) - xAbs;
    if (mode==DRAW_LINE)
      draw_string( style|BG_ONLY_MASK, startX, Y, startX+w, 0, 0 );
    if (mode==FIND_INDEX) {
      // find x pos inside block
      free(lineStr);
      return lineStartPos + startIndex + ( rightClip-startX>w ? 1 : 0 );
    }
  } else {
    w = int( string_width( lineStr+startIndex, i-startIndex, style ) );
    if (mode==DRAW_LINE)
      draw_string( style, startX, Y, startX+w, lineStr+startIndex, i-startIndex );
    if (mode==FIND_INDEX) {
      // find x pos inside block
      int di = find_x(lineStr+startIndex, i-startIndex, style, rightClip-startX);
      free(lineStr);
      IS_UTF8_ALIGNED2(buffer(), (lineStartPos+startIndex+di))
      return lineStartPos + startIndex + di;
    }
  }
  if (mode==GET_WIDTH) {
    free(lineStr);
    return startX+w;
  }

  // clear the rest of the line
  startX += w;
  style = position_style(lineStartPos, lineLen, i);
  if (mode==DRAW_LINE)
    draw_string( style|BG_ONLY_MASK, startX, Y, text_area.x+text_area.w, lineStr, lineLen );

  free(lineStr);
  IS_UTF8_ALIGNED2(buffer(), (lineStartPos+lineLen))
  return lineStartPos + lineLen;
}